

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

SnapPropertyRecord * __thiscall
JsUtil::
BaseDictionary<int,_TTD::NSSnapType::SnapPropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Item(BaseDictionary<int,_TTD::NSSnapType::SnapPropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *this,int *key)

{
  Type piVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  piVar1 = this->buckets;
  uVar4 = 0;
  if (piVar1 != (Type)0x0) {
    uVar4 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar6 = piVar1[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar6) {
      uVar4 = 0;
      do {
        if (this->entries[uVar6].
            super_DefaultHashedEntry<int,_TTD::NSSnapType::SnapPropertyRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_TTD::NSSnapType::SnapPropertyRecord_*>.
            super_ValueEntry<TTD::NSSnapType::SnapPropertyRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_TTD::NSSnapType::SnapPropertyRecord_*>_>
            .super_KeyValueEntryDataLayout2<int,_TTD::NSSnapType::SnapPropertyRecord_*>.key == *key)
        {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,uVar4);
          }
          goto LAB_008d7f49;
        }
        uVar4 = uVar4 + 1;
        uVar6 = this->entries[uVar6].
                super_DefaultHashedEntry<int,_TTD::NSSnapType::SnapPropertyRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<int,_TTD::NSSnapType::SnapPropertyRecord_*>.
                super_ValueEntry<TTD::NSSnapType::SnapPropertyRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_TTD::NSSnapType::SnapPropertyRecord_*>_>
                .super_KeyValueEntryDataLayout2<int,_TTD::NSSnapType::SnapPropertyRecord_*>.next;
      } while (-1 < (int)uVar6);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar4);
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                     ,0xed,"(i >= 0)","i >= 0");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
  uVar6 = 0xffffffff;
LAB_008d7f49:
  return this->entries[(int)uVar6].
         super_DefaultHashedEntry<int,_TTD::NSSnapType::SnapPropertyRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<int,_TTD::NSSnapType::SnapPropertyRecord_*>.
         super_ValueEntry<TTD::NSSnapType::SnapPropertyRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_TTD::NSSnapType::SnapPropertyRecord_*>_>
         .super_KeyValueEntryDataLayout2<int,_TTD::NSSnapType::SnapPropertyRecord_*>.value;
}

Assistant:

TValue Item(const TKey& key)
        {
            int i = FindEntry(key);
            Assert(i >= 0);
            return entries[i].Value();
        }